

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void jump_opt(gen_ctx_t gen_ctx)

{
  MIR_context_t ctx_00;
  MIR_insn_t pMVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  bb_insn_t_conflict pbVar7;
  in_edge_t_conflict peVar8;
  in_edge_t_conflict peVar9;
  bb_insn_t_conflict pbVar10;
  out_edge_t peVar11;
  MIR_insn_t pMVar12;
  out_edge_t peVar13;
  edge_t_conflict elem;
  bool bVar14;
  MIR_insn_t local_90;
  MIR_insn_t last_label;
  MIR_insn_t next_insn;
  MIR_insn_t insn;
  bb_insn_t_conflict bb_insn_1;
  bb_insn_t_conflict last_label_bb_insn;
  bb_insn_t_conflict label_bb_insn;
  edge_t_conflict out_e;
  edge_t_conflict e;
  int local_48;
  int bound_nop;
  int start_nop;
  int i;
  bb_insn_t_conflict bb_insn;
  long bb_deleted_insns_num;
  bb_t_conflict pbStack_28;
  int maybe_unreachable_bb_p;
  bb_t_conflict next_bb;
  bb_t_conflict bb;
  MIR_context_t ctx;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  bVar4 = false;
  lVar6 = remove_unreachable_bbs(gen_ctx);
  if (((lVar6 != 0) && (gen_ctx->debug_file != (FILE *)0x0)) && (0 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"%ld deleted unrechable bb insns\n",lVar6);
  }
  bitmap_clear(gen_ctx->temp_bitmap);
  next_bb = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2);
  do {
    if (next_bb == (bb_t_conflict)0x0) {
      next_bb = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2);
      do {
        if (next_bb == (bb_t_conflict)0x0) {
          if (bVar4) {
            remove_unreachable_bbs(gen_ctx);
          }
          enumerate_bbs(gen_ctx);
          return;
        }
        pbVar7 = DLIST_bb_insn_t_tail(&next_bb->bb_insns);
        pbStack_28 = DLIST_bb_t_next(next_bb);
        if ((((next_bb->index == 2) ||
             (peVar8 = DLIST_in_edge_t_head(&next_bb->in_edges), peVar8 == (in_edge_t_conflict)0x0))
            || (peVar9 = DLIST_in_edge_t_next(peVar8), peVar9 != (in_edge_t_conflict)0x0)) ||
           ((pbVar7 != (bb_insn_t_conflict)0x0 &&
            (((pMVar1 = pbVar7->insn, (int)*(undefined8 *)&pMVar1->field_0x18 != 0xb4 ||
              (pbVar10 = DLIST_bb_insn_t_next(pbVar7), pbVar10 != (bb_insn_t_conflict)0x0)) ||
             ((pbVar10 = DLIST_bb_insn_t_prev(pbVar7), pbVar10 != (bb_insn_t_conflict)0x0 ||
              (iVar5 = bitmap_bit_p(gen_ctx->temp_bitmap,pMVar1->ops[0].u.str.len), iVar5 != 0))))))
           )) {
          if (pbVar7 != (bb_insn_t_conflict)0x0) {
            pMVar1 = pbVar7->insn;
            iVar5 = MIR_branch_code_p((MIR_insn_code_t)*(undefined8 *)&pMVar1->field_0x18);
            if (iVar5 != 0) {
              if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                fprintf((FILE *)gen_ctx->debug_file,"  BB%lu:\n",next_bb->index);
              }
              if ((*(ushort *)&pMVar1->ops[0].field_0x8 & 0xff) != 0xc) {
                __assert_fail("insn->ops[0].mode == MIR_OP_LABEL",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1a01,"void jump_opt(gen_ctx_t)");
              }
              pMVar12 = DLIST_MIR_insn_t_next(pMVar1);
              if (((pMVar12 == (MIR_insn_t)0x0) ||
                  ((int)*(undefined8 *)&pMVar12->field_0x18 != 0xb4)) ||
                 (pMVar12 != (MIR_insn_t)pMVar1->ops[0].u.i)) {
                while( true ) {
                  pMVar12 = (MIR_insn_t)pMVar1->ops[0].u.ref;
                  do {
                    local_90 = pMVar12;
                    pMVar12 = DLIST_MIR_insn_t_next(local_90);
                    bVar14 = false;
                    if (pMVar12 != (MIR_insn_t)0x0) {
                      bVar14 = (int)*(undefined8 *)&pMVar12->field_0x18 == 0xb4;
                    }
                  } while (bVar14);
                  pMVar12 = DLIST_MIR_insn_t_next(local_90);
                  if ((pMVar12 != (MIR_insn_t)0x0) &&
                     ((int)*(undefined8 *)&pMVar12->field_0x18 == 0x76)) {
                    local_90 = (MIR_insn_t)pMVar12->ops[0].u.ref;
                  }
                  if ((MIR_insn_t)pMVar1->ops[0].u.i == local_90) break;
                  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                    fprintf((FILE *)gen_ctx->debug_file,"  Changing label in branch insn ");
                    MIR_output_insn(ctx_00,gen_ctx->debug_file,pMVar1,
                                    (gen_ctx->curr_func_item->u).func,0);
                  }
                  pvVar2 = (pMVar1->ops[0].u.ref)->data;
                  pMVar1->ops[0].u.ref = (MIR_item_t)local_90;
                  pvVar3 = local_90->data;
                  if (*(long *)((long)pvVar2 + 0x30) == *(long *)((long)pvVar3 + 0x30)) {
                    __assert_fail("label_bb_insn->bb != last_label_bb_insn->bb",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0x1a21,"void jump_opt(gen_ctx_t)");
                  }
                  elem = find_edge(next_bb,*(bb_t_conflict *)((long)pvVar2 + 0x30));
                  elem->dst = *(bb_t *)((long)pvVar3 + 0x30);
                  DLIST_in_edge_t_remove
                            ((DLIST_in_edge_t *)(*(long *)((long)pvVar2 + 0x30) + 0x30),elem);
                  DLIST_in_edge_t_append(&elem->dst->in_edges,elem);
                  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                    fprintf((FILE *)gen_ctx->debug_file,"  , result insn ");
                    MIR_output_insn(ctx_00,gen_ctx->debug_file,pMVar1,
                                    (gen_ctx->curr_func_item->u).func,1);
                  }
                  bVar4 = true;
                }
              }
              else {
                if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  fprintf((FILE *)gen_ctx->debug_file,"  Removing trivial branch insn ");
                  MIR_output_insn(ctx_00,gen_ctx->debug_file,pMVar1,
                                  (gen_ctx->curr_func_item->u).func,1);
                }
                peVar11 = DLIST_out_edge_t_head(&next_bb->out_edges);
                peVar11->fall_through_p = '\x01';
                peVar11 = DLIST_out_edge_t_next(peVar11);
                if ((peVar11 != (out_edge_t)0x0) &&
                   (peVar13 = DLIST_out_edge_t_next(peVar11), peVar13 != (out_edge_t)0x0)) {
                  __assert_fail("e == ((void*)0) || (DLIST_out_edge_t_next (e)) == ((void*)0)",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x1a0b,"void jump_opt(gen_ctx_t)");
                }
                if (peVar11 != (out_edge_t)0x0) {
                  delete_edge(peVar11);
                }
                gen_delete_insn(gen_ctx,pMVar1);
                pbStack_28 = next_bb;
              }
            }
          }
        }
        else {
          peVar11 = DLIST_out_edge_t_head(&next_bb->out_edges);
          if (peVar11 == (out_edge_t)0x0) {
            __assert_fail("out_e != ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x19f4,"void jump_opt(gen_ctx_t)");
          }
          peVar8->dst = peVar11->dst;
          DLIST_in_edge_t_remove(&next_bb->in_edges,peVar8);
          DLIST_in_edge_t_insert_before(&peVar11->dst->in_edges,peVar11,peVar8);
          peVar8 = DLIST_in_edge_t_head(&next_bb->in_edges);
          if (peVar8 != (in_edge_t_conflict)0x0) {
            __assert_fail("(DLIST_in_edge_t_head (&(bb->in_edges))) == ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x19f8,"void jump_opt(gen_ctx_t)");
          }
          remove_bb(gen_ctx,next_bb);
        }
        next_bb = pbStack_28;
      } while( true );
    }
    pbVar7 = DLIST_bb_insn_t_tail(&next_bb->bb_insns);
    if (pbVar7 != (bb_insn_t_conflict)0x0) {
      if ((int)*(undefined8 *)&pbVar7->insn->field_0x18 == 0xaa) {
        local_48 = 1;
        e._4_4_ = (int)((ulong)*(undefined8 *)&pbVar7->insn->field_0x18 >> 0x20);
      }
      else {
        iVar5 = MIR_branch_code_p((MIR_insn_code_t)*(undefined8 *)&pbVar7->insn->field_0x18);
        if (iVar5 == 0) goto LAB_0013a188;
        local_48 = 0;
        e._4_4_ = 1;
      }
      for (bound_nop = local_48; bound_nop < e._4_4_; bound_nop = bound_nop + 1) {
        bitmap_set_bit_p(gen_ctx->temp_bitmap,(size_t)(pbVar7->insn->ops[bound_nop].u.ref)->addr);
      }
    }
LAB_0013a188:
    next_bb = DLIST_bb_t_next(next_bb);
  } while( true );
}

Assistant:

static void jump_opt (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_t bb, next_bb;
  int maybe_unreachable_bb_p = FALSE;
  long bb_deleted_insns_num;

  if ((bb_deleted_insns_num = remove_unreachable_bbs (gen_ctx)) != 0) {
    DEBUG (1, { fprintf (debug_file, "%ld deleted unrechable bb insns\n", bb_deleted_insns_num); });
  }
  bitmap_clear (temp_bitmap);
  for (bb = DLIST_EL (bb_t, curr_cfg->bbs, 2); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bb_insn_t bb_insn;
    int i, start_nop, bound_nop;

    if ((bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns)) == NULL) continue;
    if (bb_insn->insn->code == MIR_SWITCH) {
      start_nop = 1;
      bound_nop = bb_insn->insn->nops;
    } else if (MIR_branch_code_p (bb_insn->insn->code)) {
      start_nop = 0;
      bound_nop = 1;
    } else {
      continue;
    }
    for (i = start_nop; i < bound_nop; i++)
      bitmap_set_bit_p (temp_bitmap, bb_insn->insn->ops[i].u.label->ops[0].u.u);
  }
  for (bb = DLIST_EL (bb_t, curr_cfg->bbs, 2); bb != NULL; bb = next_bb) {
    edge_t e, out_e;
    bb_insn_t label_bb_insn, last_label_bb_insn, bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    MIR_insn_t insn, next_insn, last_label;

    next_bb = DLIST_NEXT (bb_t, bb);
    if (bb->index != 2 /* BB2 will be used for machinize */
        && (e = DLIST_HEAD (in_edge_t, bb->in_edges)) != NULL && DLIST_NEXT (in_edge_t, e) == NULL
        && (bb_insn == NULL
            || ((insn = bb_insn->insn)->code == MIR_LABEL && DLIST_NEXT (bb_insn_t, bb_insn) == NULL
                && DLIST_PREV (bb_insn_t, bb_insn) == NULL
                && !bitmap_bit_p (temp_bitmap, insn->ops[0].u.u)))) {
      /* empty bb or bb with the only label which can be removed. we can have more one the same
         dest edge (e.g. when removed cond branch to the next insn). */
      out_e = DLIST_HEAD (out_edge_t, bb->out_edges);
      gen_assert (out_e != NULL);
      e->dst = out_e->dst;
      DLIST_REMOVE (in_edge_t, bb->in_edges, e);
      DLIST_INSERT_BEFORE (in_edge_t, out_e->dst->in_edges, out_e, e);
      gen_assert (DLIST_HEAD (in_edge_t, bb->in_edges) == NULL);
      /* Don't shorten phis in dest bbs. We don't care about SSA in this kind of bb. */
      remove_bb (gen_ctx, bb);
      continue;
    }
    if (bb_insn == NULL) continue;
    insn = bb_insn->insn;
    if (!MIR_branch_code_p (insn->code)) continue;
    DEBUG (2, { fprintf (debug_file, "  BB%lu:\n", (unsigned long) bb->index); });
    gen_assert (insn->ops[0].mode == MIR_OP_LABEL);
    if ((next_insn = DLIST_NEXT (MIR_insn_t, insn)) != NULL && next_insn->code == MIR_LABEL
        && next_insn == insn->ops[0].u.label) {
      DEBUG (2, {
        fprintf (debug_file, "  Removing trivial branch insn ");
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, TRUE);
      });
      out_e = DLIST_HEAD (out_edge_t, bb->out_edges);
      out_e->fall_through_p = TRUE;
      e = DLIST_NEXT (out_edge_t, out_e);
      gen_assert (e == NULL || DLIST_NEXT (out_edge_t, e) == NULL);
      if (e != NULL) delete_edge (e);
      gen_delete_insn (gen_ctx, insn);
      next_bb = bb; /* bb can became empty after removing jump.  */
    } else {
      for (;;) {
        for (last_label = insn->ops[0].u.label;
             (next_insn = DLIST_NEXT (MIR_insn_t, last_label)) != NULL
             && next_insn->code == MIR_LABEL;)
          last_label = next_insn;
        if ((next_insn = DLIST_NEXT (MIR_insn_t, last_label)) != NULL
            && next_insn->code == MIR_JMP) {
          last_label = next_insn->ops[0].u.label;
        }
        if (insn->ops[0].u.label == last_label) break;
        DEBUG (2, {
          fprintf (debug_file, "  Changing label in branch insn ");
          MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, FALSE);
        });
        label_bb_insn = insn->ops[0].u.label->data;
        insn->ops[0].u.label = last_label;
        last_label_bb_insn = last_label->data;
        gen_assert (label_bb_insn->bb != last_label_bb_insn->bb);
        e = find_edge (bb, label_bb_insn->bb);
        e->dst = last_label_bb_insn->bb;
        DLIST_REMOVE (in_edge_t, label_bb_insn->bb->in_edges, e);
        /* We don't need to keep the edge order as we are already off SSA: */
        DLIST_APPEND (in_edge_t, e->dst->in_edges, e);
        DEBUG (2, {
          fprintf (debug_file, "  , result insn ");
          MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, TRUE);
        });
        maybe_unreachable_bb_p = TRUE;
      }
    }
  }
  /* Don't shorten phis in dest bbs. We don't care about SSA for new trivial unreachable bbs. */
  if (maybe_unreachable_bb_p) remove_unreachable_bbs (gen_ctx);
  enumerate_bbs (gen_ctx);
}